

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

value_type * __thiscall
google::
sparse_hashtable<std::pair<std::__cxx11::string_const,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>>,std::__cxx11::string,Hasher,google::sparse_hash_map<std::__cxx11::string,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>>>>::SelectKey,google::sparse_hash_map<std::__cxx11::string,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>>>>
::
find_or_insert<google::sparse_hash_map<std::__cxx11::string,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>>>>::DefaultValue>
          (sparse_hashtable<std::pair<std::__cxx11::string_const,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>>,std::__cxx11::string,Hasher,google::sparse_hash_map<std::__cxx11::string,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>>>>::SelectKey,google::sparse_hash_map<std::__cxx11::string,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<std::__cxx11::string_const,google::sparse_hash_map<int,std::__cxx11::string,std::hash<int>,std::equal_to<int>,google::libc_allocator_with_realloc<std::pair<int_const,std::__cxx11::string>>>>>>
           *this,key_type *key)

{
  bool bVar1;
  pair<unsigned_long,_unsigned_long> pVar2;
  DefaultValue default_value;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_e8;
  pair<_f1c03ca1_> local_70;
  
  pVar2 = find_position<std::__cxx11::string>(this,key);
  if (pVar2.first == 0xffffffffffffffff) {
    bVar1 = sparse_hashtable<$6111fa4$>::resize_delta((sparse_hashtable<_6111fa4_> *)this,1);
    if (bVar1) {
      sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::DefaultValue::operator()(&local_e8,&default_value,key);
      sparse_hashtable<$6111fa4$>::insert_noresize
                (&local_70,(sparse_hashtable<_6111fa4_> *)this,&local_e8);
    }
    else {
      sparse_hash_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
      ::DefaultValue::operator()(&local_e8,&default_value,key);
      sparse_hashtable<$6111fa4$>::insert_at
                (&local_70.first,(sparse_hashtable<_6111fa4_> *)this,&local_e8,pVar2.second);
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
    ::~pair(&local_e8);
    local_e8.first.field_2._8_8_ = local_70.first.pos.col_current;
  }
  else {
    sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
    ::get_iter((nonempty_iterator *)&local_e8,
               (sparsetable<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::sparse_hash_map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<int>,_std::equal_to<int>,_google::libc_allocator_with_realloc<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>_>
                *)(this + 0x68),pVar2.first);
  }
  return (value_type *)local_e8.first.field_2._8_8_;
}

Assistant:

value_type& find_or_insert(const key_type& key) {
    // First, double-check we're not inserting delkey
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) &&
           "Inserting the deleted key");
    const std::pair<size_type, size_type> pos = find_position(key);
    DefaultValue default_value;
    if (pos.first != ILLEGAL_BUCKET) {  // object was already there
      return *table.get_iter(pos.first);
    } else if (resize_delta(1)) {  // needed to rehash to make room
      // Since we resized, we can't use pos, so recalculate where to
      // insert.
      return *insert_noresize(default_value(key)).first;
    } else {  // no need to rehash, insert right here
      return *insert_at(default_value(key), pos.second);
    }
  }